

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
::disposeImpl(HeapDisposer<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<kj::MainBuilder::Impl,_std::nullptr_t>::dispose
              ((Own<kj::MainBuilder::Impl,_std::nullptr_t> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x18);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }